

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianContIntNoDamping
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor)

{
  ChKblockGeneric *pCVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  pointer pLVar72;
  PointerType pdVar73;
  uint uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined8 uVar80;
  int iVar81;
  long lVar82;
  long lVar83;
  double *pdVar84;
  ulong uVar85;
  int iVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  char *__function;
  long lVar90;
  long lVar91;
  undefined1 (*pauVar92) [64];
  long lVar93;
  ActualDstType actualDst;
  undefined1 (*pauVar94) [64];
  ChElementShellANCF_3443 *this_00;
  ChElementShellANCF_3443 *this_01;
  long lVar95;
  double *pdVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  ulong uVar101;
  long lVar102;
  ulong uVar103;
  PointerType pdVar104;
  double *pdVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  double dVar137;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  ChMatrixNM<double,_6,_6> D;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Matrix3xN e_bar;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict3 S_scaled_SD;
  ulong local_5030;
  int local_5008;
  int local_5004;
  DenseStorage<double,__1,__1,__1,_1> local_5000;
  DenseStorage<double,__1,__1,__1,_1> local_4fe0;
  DenseStorage<double,__1,__1,__1,_1> local_4fc0;
  long local_4fa8;
  undefined1 local_4fa0 [96];
  pointer local_4f40;
  pointer local_4f38;
  pointer local_4f30;
  pointer local_4f28;
  pointer local_4f20;
  pointer local_4f18;
  pointer local_4f10;
  pointer local_4f08;
  pointer local_4f00;
  double local_4ef8;
  double local_4ef0;
  double local_4ee8;
  double local_4ee0;
  double local_4ed8;
  double local_4ed0;
  double local_4ec8;
  double local_4ec0;
  double local_4eb8;
  double local_4eb0;
  double local_4ea8;
  double local_4ea0;
  double local_4e98;
  double local_4e90;
  double local_4e88;
  undefined1 local_4e80 [64];
  assign_op<double,_double> *local_4e10;
  double local_4e08;
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  DenseStorage<double,__1,__1,__1,_1> *local_4d10;
  undefined1 local_4d00 [64];
  undefined1 *local_4c90;
  undefined1 local_4c88 [8];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  Matrix3xN local_3200;
  undefined1 local_3080 [8];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TStack_3078;
  assign_op<double,_double> *paStack_3070;
  variable_if_dynamic<long,__1> vStack_3068;
  variable_if_dynamic<long,__1> vStack_3060;
  long lStack_3058;
  Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_> aTStack_3050 [82];
  undefined1 local_2dc0 [11664];
  
  local_4d10 = (DenseStorage<double,__1,__1,__1,_1> *)Kfactor;
  CalcCoordMatrix(this,&local_3200);
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value |
      (H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  TStack_3078.m_matrix = (non_const_type)local_3ec0;
  auVar107._56_8_ = 0;
  auVar107._0_56_ = local_3ec0._8_56_;
  local_3ec0 = auVar107 << 0x40;
  local_4840._0_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_data;
  local_3080 = (undefined1  [8])local_4840;
  local_4840._16_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  paStack_3070 = (assign_op<double,_double> *)local_4fa0;
  vStack_3068.m_value = (long)H;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_3080);
  if (0 < this->m_numLayers) {
    local_4e10 = (assign_op<double,_double> *)&this->m_SD;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_4d10;
    local_35c0 = vbroadcastsd_avx512f(auVar4);
    local_5004 = 0x40;
    local_5008 = 0x20;
    local_5030 = 0;
    lVar93 = 0;
    do {
      if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x10) {
LAB_007936d6:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 16, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 16, BlockCols = 96, InnerPanel = false]"
        ;
LAB_00793662:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      uVar74 = (int)lVar93 * 0x60;
      uVar101 = CONCAT44(0,uVar74);
      lVar89 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar89 < (long)(uVar101 + 0x60)) goto LAB_007936d6;
      local_3080 = (undefined1  [8])(*(long *)local_4e10 + uVar101 * 8);
      paStack_3070 = local_4e10;
      vStack_3068.m_value = 0;
      aTStack_3050[0].m_matrix = &local_3200;
      local_4fa8 = lVar93;
      local_4e08 = (double)(uVar101 + 0x60);
      vStack_3060.m_value = uVar101;
      lStack_3058 = lVar89;
      memset((Matrix<double,_96,_3,_0,_96,_3> *)local_4840,0,0x900);
      local_3ec0._0_8_ = 0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>>,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,96,3,0,96,3>>
                ((Matrix<double,_96,_3,_0,_96,_3> *)local_4840,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>
                  *)local_3080,aTStack_3050,(Scalar *)local_3ec0);
      local_4fc0.m_cols = 0;
      local_4fc0.m_data = (double *)0x0;
      local_4fc0.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_4fc0,0x2400,0x30,0xc0);
      lVar82 = (long)local_5004;
      lVar83 = (long)local_5008;
      local_4e80._0_8_ = uVar101;
      lVar87 = (long)(int)uVar74;
      lVar93 = lVar87 + 0x20;
      local_4dc0._0_8_ = local_4fc0.m_rows;
      iVar81 = uVar74 + 0x20;
      local_4e00._0_4_ = iVar81;
      lVar90 = (long)iVar81;
      lVar89 = lVar90 + 0x20;
      iVar86 = uVar74 + 0x40;
      pauVar92 = (undefined1 (*) [64])(local_4fc0.m_data + 0xb8);
      local_4d00._0_8_ = local_4fc0.m_cols * 0x18;
      lVar102 = local_4fc0.m_cols * 0x10;
      local_4d80._0_4_ = iVar86;
      lVar88 = (long)iVar86;
      lVar98 = lVar88 + 0x20;
      lVar99 = 0;
      lVar91 = 0;
      do {
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar91) ||
             (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar95 < lVar93)) || (local_4fc0.m_rows <= lVar99)) ||
           (local_4fc0.m_cols < 0x20)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar108._8_8_ = local_4840._8_8_;
        auVar108._0_8_ = local_4840._0_8_;
        auVar108._16_8_ = local_4840._16_8_;
        auVar108._24_40_ = local_4840._24_40_;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),auVar108);
        pauVar92[-0x17] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4800);
        pauVar92[-0x16] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_47c0);
        pauVar92[-0x15] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4780);
        pauVar92[-0x14] = auVar107;
        if (((iVar81 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar91)) ||
           ((lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar89 || (local_4fc0.m_cols < 0x40))))
        goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4740);
        pauVar92[-0x13] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4700);
        pauVar92[-0x12] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_46c0);
        pauVar92[-0x11] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4680);
        pauVar92[-0x10] = auVar107;
        if (((iVar86 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar91)) ||
           ((lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar98 || (local_4fc0.m_cols < 0x60))))
        goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4640);
        pauVar92[-0xf] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4600);
        pauVar92[-0xe] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_45c0);
        pauVar92[-0xd] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4580);
        pauVar92[-0xc] = auVar107;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar91) ||
             (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar95 < lVar98)) || (lVar95 < lVar89)) ||
           (local_4fc0.m_cols < 0x80)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4740);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4640);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-0xb] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4700);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4600);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-10] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_46c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_45c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-9] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4680);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4580);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-8] = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar98)) ||
           ((lVar95 < lVar93 || (local_4fc0.m_cols < 0xa0)))) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar109._8_8_ = local_4840._8_8_;
        auVar109._0_8_ = local_4840._0_8_;
        auVar109._16_8_ = local_4840._16_8_;
        auVar109._24_40_ = local_4840._24_40_;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),auVar109);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4640);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-7] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4800);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4600);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-6] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_47c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_45c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-5] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4780);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4580);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-4] = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar89)) ||
           ((lVar95 < lVar93 || (local_4fc0.m_cols < 0xc0)))) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar110._8_8_ = local_4840._8_8_;
        auVar110._0_8_ = local_4840._0_8_;
        auVar110._16_8_ = local_4840._16_8_;
        auVar110._24_40_ = local_4840._24_40_;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),auVar110);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4740);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-3] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4800);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4700);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-2] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_47c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_46c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        pauVar92[-1] = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4780);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4680);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *pauVar92 = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar93)) || (local_4fc0.m_rows <= lVar99 + 1))
        goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4540);
        *(undefined1 (*) [64])(pauVar92[-0x17] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4500);
        *(undefined1 (*) [64])(pauVar92[-0x16] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_44c0);
        *(undefined1 (*) [64])(pauVar92[-0x15] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4480);
        *(undefined1 (*) [64])(pauVar92[-0x14] + local_4fc0.m_cols * 8) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar91) ||
           (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar95 < lVar89)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4440);
        *(undefined1 (*) [64])(pauVar92[-0x13] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4400);
        *(undefined1 (*) [64])(pauVar92[-0x12] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_43c0);
        *(undefined1 (*) [64])(pauVar92[-0x11] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4380);
        *(undefined1 (*) [64])(pauVar92[-0x10] + local_4fc0.m_cols * 8) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar91) ||
           (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar95 < lVar98)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4340);
        *(undefined1 (*) [64])(pauVar92[-0xf] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4300);
        *(undefined1 (*) [64])(pauVar92[-0xe] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_42c0);
        *(undefined1 (*) [64])(pauVar92[-0xd] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4280);
        *(undefined1 (*) [64])(pauVar92[-0xc] + local_4fc0.m_cols * 8) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar98)) || (lVar95 < lVar89)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4440);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4340);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-0xb] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4400);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4300);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-10] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_43c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_42c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-9] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4380);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4280);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-8] + local_4fc0.m_cols * 8) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar98)) || (lVar95 < lVar93)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4540);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4340);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-7] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4500);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4300);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-6] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_44c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_42c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-5] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4480);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4280);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-4] + local_4fc0.m_cols * 8) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar89)) || (lVar95 < lVar93)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4540);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4440);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-3] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4500);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4400);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-2] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_44c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_43c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-1] + local_4fc0.m_cols * 8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4480);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4380);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(*pauVar92 + local_4fc0.m_cols * 8) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar93)) || (local_4fc0.m_rows <= lVar99 + 2))
        goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4240);
        *(undefined1 (*) [64])(pauVar92[-0x17] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4200);
        *(undefined1 (*) [64])(pauVar92[-0x16] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_41c0);
        *(undefined1 (*) [64])(pauVar92[-0x15] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4180);
        *(undefined1 (*) [64])(pauVar92[-0x14] + lVar102) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar91) ||
           (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar95 < lVar89)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4140);
        *(undefined1 (*) [64])(pauVar92[-0x13] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4100);
        *(undefined1 (*) [64])(pauVar92[-0x12] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_40c0);
        *(undefined1 (*) [64])(pauVar92[-0x11] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4080);
        *(undefined1 (*) [64])(pauVar92[-0x10] + lVar102) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar91) ||
           (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar95 < lVar98)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4040);
        *(undefined1 (*) [64])(pauVar92[-0xf] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4000);
        *(undefined1 (*) [64])(pauVar92[-0xe] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_3fc0);
        *(undefined1 (*) [64])(pauVar92[-0xd] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_3f80);
        *(undefined1 (*) [64])(pauVar92[-0xc] + lVar102) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar98)) || (lVar95 < lVar89)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4140);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4040);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-0xb] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4100);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4000);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-10] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_40c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_3fc0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-9] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4080);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_3f80);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-8] + lVar102) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar98)) || (lVar95 < lVar93)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95),local_4240);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4040);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-7] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 8),local_4200);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4000);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-6] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x10),
                                  local_41c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_3fc0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-5] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar88 + lVar95 + 0x18),
                                  local_4180);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_3f80);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-4] + lVar102) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar91) ||
            (lVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar95 < lVar89)) || (lVar95 < lVar93)) goto LAB_0079364d;
        pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar95 = lVar95 * lVar91;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95),local_4240);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95),local_4140);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-3] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 8),local_4200);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 8),local_4100);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-2] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x10),
                                  local_41c0);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x10),
                                  local_40c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(pauVar92[-1] + lVar102) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar90 + lVar95 + 0x18),
                                  local_4180);
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar87 + lVar95 + 0x18),
                                  local_4080);
        auVar107 = vaddpd_avx512f(auVar107,auVar108);
        *(undefined1 (*) [64])(*pauVar92 + lVar102) = auVar107;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + local_4fc0.m_cols * 0x18);
        lVar99 = lVar99 + 3;
        lVar91 = lVar91 + 1;
      } while (lVar99 != 0x30);
      TStack_3078.m_matrix = (non_const_type)local_4d10;
      vStack_3068.m_value = (long)local_4840;
      local_4fe0.m_data = (double *)local_3ec0;
      local_4fa0._0_8_ = &local_4fe0;
      local_4fa0._8_8_ = local_3080;
      local_4fa0._16_8_ = &local_5000;
      auVar111._8_8_ = local_4840._8_8_;
      auVar111._0_8_ = local_4840._0_8_;
      auVar111._16_8_ = local_4840._16_8_;
      auVar111._24_40_ = local_4840._24_40_;
      local_3ec0 = vmulpd_avx512f(local_35c0,auVar111);
      local_4fa0._24_8_ = local_4fe0.m_data;
      Eigen::internal::
      copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_8,_288>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_4fa0);
      auVar107 = local_4e80;
      lVar93 = local_4fa8 * 0x20 + 0x20;
      uVar80 = local_4e80._0_8_;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar93) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
LAB_0079369d:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00793662;
      }
      pdVar96 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar89 = 0x2c0;
      do {
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20),
                                  *(undefined1 (*) [64])(local_4180 + lVar89));
        *(undefined1 (*) [64])(local_4180 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 8),
                                  *(undefined1 (*) [64])(local_4140 + lVar89));
        *(undefined1 (*) [64])(local_4140 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 0x10),
                                  *(undefined1 (*) [64])(local_4100 + lVar89));
        *(undefined1 (*) [64])(local_4100 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 0x18),
                                  *(undefined1 (*) [64])(local_40c0 + lVar89));
        *(undefined1 (*) [64])(local_40c0 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20),
                                  *(undefined1 (*) [64])(local_4080 + lVar89));
        *(undefined1 (*) [64])(local_4080 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 8),
                                  *(undefined1 (*) [64])(local_4040 + lVar89));
        *(undefined1 (*) [64])(local_4040 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 0x10),
                                  *(undefined1 (*) [64])(local_4000 + lVar89));
        *(undefined1 (*) [64])(local_4000 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 0x18),
                                  *(undefined1 (*) [64])(local_3fc0 + lVar89));
        *(undefined1 (*) [64])(local_3fc0 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20),
                                  *(undefined1 (*) [64])(local_3f80 + lVar89));
        *(undefined1 (*) [64])(local_3f80 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 8),
                                  *(undefined1 (*) [64])(local_3f40 + lVar89));
        *(undefined1 (*) [64])(local_3f40 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 0x10),
                                  *(undefined1 (*) [64])(local_3f00 + lVar89));
        *(undefined1 (*) [64])(local_3f00 + lVar89) = auVar108;
        auVar108 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + local_4fa8 * 0x20 + 0x18),
                                  *(undefined1 (*) [64])(local_3ec0 + lVar89));
        *(undefined1 (*) [64])(local_3ec0 + lVar89) = auVar108;
        lVar89 = lVar89 + 0x300;
      } while (lVar89 != 0xbc0);
      local_4d80._0_8_ = lVar93;
      local_4e00._0_8_ = local_4fa8 * 0x20;
      local_4fe0.m_data = (double *)0x0;
      local_4fe0.m_rows = 0;
      local_4fe0.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_4fe0,0x2400,0x30,0xc0);
      auVar108 = local_4e80;
      lVar93 = uVar80 + 0x20;
      lVar87 = (long)(auVar107._0_4_ + 0x20);
      lVar89 = lVar87 + 0x20;
      lVar90 = (long)(auVar107._0_4_ + 0x40);
      lVar98 = lVar90 + 0x20;
      pdVar96 = (((PlainObjectBase<Eigen::Matrix<double,_96,_3,_0,_96,_3>_> *)local_4fe0.m_data)->
                m_storage).m_data.array + 0xb8;
      local_4dc0._0_8_ = local_4fe0.m_cols * 0x18;
      lVar91 = 0;
      lVar88 = 0;
      do {
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar88) ||
             (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar99 < lVar93)) || (local_4fe0.m_rows <= lVar91)) ||
           (local_4fe0.m_cols < 0x20)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99),local_3ec0);
        *(undefined1 (*) [64])((plain_array<double,_288,_0,_64> *)(pdVar96 + -0xb8))->array =
             auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 8),local_3e80)
        ;
        *(undefined1 (*) [64])(pdVar96 + -0xb0) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 0x10),
                                  local_3e40);
        *(undefined1 (*) [64])(pdVar96 + -0xa8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 0x18),
                                  local_3e00);
        *(undefined1 (*) [64])(pdVar96 + -0xa0) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar89)) || (local_4fe0.m_cols < 0x40))
        goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_3dc0);
        *(undefined1 (*) [64])(pdVar96 + -0x98) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3d80);
        *(undefined1 (*) [64])(pdVar96 + -0x90) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3d40);
        *(undefined1 (*) [64])(pdVar96 + -0x88) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3d00);
        *(undefined1 (*) [64])(pdVar96 + -0x80) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar98)) || (local_4fe0.m_cols < 0x60))
        goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_3cc0);
        *(undefined1 (*) [64])(pdVar96 + -0x78) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3c80);
        *(undefined1 (*) [64])(pdVar96 + -0x70) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3c40);
        *(undefined1 (*) [64])(pdVar96 + -0x68) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3c00);
        *(undefined1 (*) [64])(pdVar96 + -0x60) = auVar107;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar88) ||
             (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar99 < lVar98)) || (lVar99 < lVar89)) ||
           (local_4fe0.m_cols < 0x80)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_3dc0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_3cc0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x58) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3d80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3c80);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x50) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3d40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3c40);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x48) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3d00);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3c00);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x40) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar98)) ||
           ((lVar99 < lVar93 || (local_4fe0.m_cols < 0xa0)))) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_3ec0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99),
                                  local_3cc0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x38) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3e80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 8),
                                  local_3c80);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x30) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3e40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x10)
                                  ,local_3c40);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x28) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3e00);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x18)
                                  ,local_3c00);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x20) = auVar107;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar88) ||
             (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar99 < lVar89)) || (lVar99 < lVar93)) ||
           (local_4fe0.m_cols < 0xc0)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_3ec0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99),
                                  local_3dc0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x18) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3e80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 8),
                                  local_3d80);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -0x10) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3e40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x10)
                                  ,local_3d40);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + -8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3e00);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x18)
                                  ,local_3d00);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])pdVar96 = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar93)) || (local_4fe0.m_rows <= lVar91 + 1))
        goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99),local_3bc0);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0xb8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 8),local_3b80)
        ;
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0xb0) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 0x10),
                                  local_3b40);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0xa8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 0x18),
                                  local_3b00);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0xa0) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar88) ||
           (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar99 < lVar89)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_3ac0);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x98) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3a80);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x90) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3a40);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x88) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3a00);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x80) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar88) ||
           (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar99 < lVar98)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_39c0);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x78) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3980);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x70) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3940);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x68) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3900);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x60) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar98)) || (lVar99 < lVar89)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_3ac0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_39c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x58) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3a80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3980);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x50) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3a40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3940);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x48) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3a00);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3900);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x40) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar98)) || (lVar99 < lVar93)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_3bc0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99),
                                  local_39c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x38) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3b80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 8),
                                  local_3980);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x30) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3b40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x10)
                                  ,local_3940);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x28) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3b00);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x18)
                                  ,local_3900);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x20) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar89)) || (lVar99 < lVar93)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_3bc0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99),
                                  local_3ac0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x18) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3b80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 8),
                                  local_3a80);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -0x10) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3b40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x10)
                                  ,local_3a40);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols + -8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3b00);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x18)
                                  ,local_3a00);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar93)) || (local_4fe0.m_rows <= lVar91 + 2))
        goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99),local_38c0);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0xb8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 8),local_3880)
        ;
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0xb0) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 0x10),
                                  local_3840);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0xa8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + uVar101 + lVar99 + 0x18),
                                  local_3800);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0xa0) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar88) ||
           (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar99 < lVar89)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_37c0);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x98) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3780);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x90) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3740);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x88) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3700);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x80) = auVar107;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar88) ||
           (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar99 < lVar98)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_36c0);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x78) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3680);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x70) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3640);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x68) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3600);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x60) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar98)) || (lVar99 < lVar89)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_37c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_36c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x58) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3780);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3680);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x50) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3740);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3640);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x48) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3700);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3600);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x40) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar98)) || (lVar99 < lVar93)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99),local_38c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99),
                                  local_36c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x38) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 8),local_3880);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 8),
                                  local_3680);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x30) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x10),
                                  local_3840);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x10)
                                  ,local_3640);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x28) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar90 + lVar99 + 0x18),
                                  local_3800);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x18)
                                  ,local_3600);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x20) = auVar107;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar88) ||
            (lVar99 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar99 < lVar89)) || (lVar99 < lVar93)) goto LAB_0079364d;
        pdVar84 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar99 = lVar99 * lVar88;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99),local_38c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99),
                                  local_37c0);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x18) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 8),local_3880);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 8),
                                  local_3780);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -0x10) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x10),
                                  local_3840);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x10)
                                  ,local_3740);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2 + -8) = auVar107;
        auVar107 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + lVar87 + lVar99 + 0x18),
                                  local_3800);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar84 + local_4e80._0_8_ + lVar99 + 0x18)
                                  ,local_3700);
        auVar107 = vaddpd_avx512f(auVar107,auVar109);
        *(undefined1 (*) [64])(pdVar96 + local_4fe0.m_cols * 2) = auVar107;
        pdVar96 = pdVar96 + local_4fe0.m_cols * 3;
        lVar91 = lVar91 + 3;
        lVar88 = lVar88 + 1;
      } while (lVar91 != 0x30);
      pLVar72 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar89 = *(long *)((long)&(pLVar72->m_material).
                                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + local_4e00._0_8_);
      this_01 = *(ChElementShellANCF_3443 **)
                 ((long)&(pLVar72->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount + local_4e00._0_8_);
      if (this_01 == (ChElementShellANCF_3443 *)0x0) {
        this_00 = (ChElementShellANCF_3443 *)local_4fa0;
        memcpy(this_00,(void *)(lVar89 + 0x20),0x120);
      }
      else {
        this_00 = (ChElementShellANCF_3443 *)local_4fa0;
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar1 = &(this_01->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar1 = &(this_01->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(this_00,(void *)(lVar89 + 0x20),0x120);
        if (this_01 != (ChElementShellANCF_3443 *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
          this_00 = this_01;
        }
      }
      RotateReorderStiffnessMatrix
                (this_00,(ChMatrixNM<double,_6,_6> *)local_4fa0,
                 *(double *)
                  ((long)&((this->m_layers).
                           super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_theta + local_4e00._0_8_));
      local_5000.m_data = (double *)0x0;
      local_5000.m_rows = 0;
      local_5000.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_5000,0x2400,0x30,0xc0);
      if (((((((local_4fe0.m_rows < 0x30) || (local_4fe0.m_cols < 0x20)) ||
             (local_4fe0.m_cols < 0x40)) ||
            ((local_4fe0.m_cols < 0x60 || (local_4fe0.m_cols < 0x80)))) ||
           (local_4fe0.m_cols < 0xa0)) || ((local_4fe0.m_cols < 0xc0 || (local_5000.m_rows < 0x30)))
          ) || (local_5000.m_cols < 0x20)) {
LAB_00793686:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 48, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 48, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_00793662;
      }
      auVar75._8_8_ = local_4fa0._8_8_;
      auVar75._0_8_ = local_4fa0._0_8_;
      auVar76._8_8_ = local_4fa0._16_8_;
      auVar76._0_8_ = local_4fa0._8_8_;
      auVar77._8_8_ = local_4fa0._24_8_;
      auVar77._0_8_ = local_4fa0._16_8_;
      auVar78._8_8_ = local_4fa0._32_8_;
      auVar78._0_8_ = local_4fa0._24_8_;
      auVar79._8_8_ = local_4fa0._40_8_;
      auVar79._0_8_ = local_4fa0._32_8_;
      auVar107 = vbroadcastsd_avx512f(auVar75);
      auVar109 = vbroadcastsd_avx512f(auVar76);
      auVar110 = vbroadcastsd_avx512f(auVar77);
      auVar111 = vbroadcastsd_avx512f(auVar78);
      auVar112 = vbroadcastsd_avx512f(auVar79);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_4fa0._40_8_;
      auVar113 = vbroadcastsd_avx512f(auVar5);
      pauVar92 = (undefined1 (*) [64])(local_5000.m_data + 0x18);
      pdVar84 = (((PlainObjectBase<Eigen::Matrix<double,_96,_3,_0,_96,_3>_> *)local_4fe0.m_data)->
                m_storage).m_data.array + 0xb8;
      lVar89 = local_5000.m_cols * 8;
      lVar98 = 0x30;
      pdVar96 = pdVar84;
      do {
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])
                                            ((plain_array<double,_288,_0,_64> *)(pdVar96 + -0xb8))->
                                            array);
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x98));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x78));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x58));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x38));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x18));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-3] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xb0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x90));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x70));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x50));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x30));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x10));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-2] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa8));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x88));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x68));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x48));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x28));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -8));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-1] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x80));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x60));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x40));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x20));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])pdVar96);
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        *pauVar92 = auVar114;
        pdVar96 = pdVar96 + local_4fe0.m_cols;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar89);
        lVar98 = lVar98 + -1;
      } while (lVar98 != 0);
      if (local_5000.m_cols < 0x40) goto LAB_00793686;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_4fa0._48_8_;
      auVar107 = vbroadcastsd_avx512f(auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_4fa0._56_8_;
      auVar109 = vbroadcastsd_avx512f(auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_4fa0._64_8_;
      auVar110 = vbroadcastsd_avx512f(auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_4fa0._72_8_;
      auVar111 = vbroadcastsd_avx512f(auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_4fa0._80_8_;
      auVar112 = vbroadcastsd_avx512f(auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_4fa0._88_8_;
      auVar113 = vbroadcastsd_avx512f(auVar11);
      pauVar92 = (undefined1 (*) [64])(local_5000.m_data + 0x38);
      lVar98 = 0x30;
      pdVar96 = pdVar84;
      do {
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])
                                            ((plain_array<double,_288,_0,_64> *)(pdVar96 + -0xb8))->
                                            array);
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x98));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x78));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x58));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x38));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x18));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-3] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xb0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x90));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x70));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x50));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x30));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x10));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-2] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa8));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x88));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x68));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x48));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x28));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -8));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-1] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x80));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x60));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x40));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x20));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])pdVar96);
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        *pauVar92 = auVar114;
        pdVar96 = pdVar96 + local_4fe0.m_cols;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar89);
        lVar98 = lVar98 + -1;
      } while (lVar98 != 0);
      if (local_5000.m_cols < 0x60) goto LAB_00793686;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_4f40;
      auVar107 = vbroadcastsd_avx512f(auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_4f38;
      auVar109 = vbroadcastsd_avx512f(auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_4f30;
      auVar110 = vbroadcastsd_avx512f(auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_4f28;
      auVar111 = vbroadcastsd_avx512f(auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_4f20;
      auVar112 = vbroadcastsd_avx512f(auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_4f18;
      auVar113 = vbroadcastsd_avx512f(auVar17);
      pauVar92 = (undefined1 (*) [64])(local_5000.m_data + 0x58);
      lVar98 = 0x30;
      pdVar96 = pdVar84;
      do {
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])
                                            ((plain_array<double,_288,_0,_64> *)(pdVar96 + -0xb8))->
                                            array);
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x98));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x78));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x58));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x38));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x18));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-3] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xb0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x90));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x70));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x50));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x30));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x10));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-2] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa8));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x88));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x68));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x48));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x28));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -8));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-1] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x80));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x60));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x40));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x20));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])pdVar96);
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        *pauVar92 = auVar114;
        pdVar96 = pdVar96 + local_4fe0.m_cols;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar89);
        lVar98 = lVar98 + -1;
      } while (lVar98 != 0);
      if (local_5000.m_cols < 0x80) goto LAB_00793686;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_4f10;
      auVar107 = vbroadcastsd_avx512f(auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_4f08;
      auVar109 = vbroadcastsd_avx512f(auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_4f00;
      auVar110 = vbroadcastsd_avx512f(auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_4ef8;
      auVar111 = vbroadcastsd_avx512f(auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_4ef0;
      auVar112 = vbroadcastsd_avx512f(auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_4ee8;
      auVar113 = vbroadcastsd_avx512f(auVar23);
      pauVar92 = (undefined1 (*) [64])(local_5000.m_data + 0x78);
      lVar98 = 0x30;
      pdVar96 = pdVar84;
      do {
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])
                                            ((plain_array<double,_288,_0,_64> *)(pdVar96 + -0xb8))->
                                            array);
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x98));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x78));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x58));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x38));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x18));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-3] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xb0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x90));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x70));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x50));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x30));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x10));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-2] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa8));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x88));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x68));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x48));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x28));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -8));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-1] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x80));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x60));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x40));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x20));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])pdVar96);
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        *pauVar92 = auVar114;
        pdVar96 = pdVar96 + local_4fe0.m_cols;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar89);
        lVar98 = lVar98 + -1;
      } while (lVar98 != 0);
      if (local_5000.m_cols < 0xa0) goto LAB_00793686;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_4ee0;
      auVar107 = vbroadcastsd_avx512f(auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_4ed8;
      auVar109 = vbroadcastsd_avx512f(auVar25);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_4ed0;
      auVar110 = vbroadcastsd_avx512f(auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_4ec8;
      auVar111 = vbroadcastsd_avx512f(auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_4ec0;
      auVar112 = vbroadcastsd_avx512f(auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_4eb8;
      auVar113 = vbroadcastsd_avx512f(auVar29);
      pauVar92 = (undefined1 (*) [64])(local_5000.m_data + 0x98);
      lVar98 = 0x30;
      pdVar96 = pdVar84;
      do {
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])
                                            ((plain_array<double,_288,_0,_64> *)(pdVar96 + -0xb8))->
                                            array);
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x98));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x78));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x58));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x38));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x18));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-3] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xb0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x90));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x70));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x50));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x30));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -0x10));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-2] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa8));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x88));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x68));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x48));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x28));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + -8));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-1] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar96 + -0xa0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar96 + -0x80));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar96 + -0x60));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + -0x40));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + -0x20));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])pdVar96);
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        *pauVar92 = auVar114;
        pdVar96 = pdVar96 + local_4fe0.m_cols;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar89);
        lVar98 = lVar98 + -1;
      } while (lVar98 != 0);
      if ((local_5000.m_rows < 0x30) || (local_5000.m_cols < 0xc0)) goto LAB_00793686;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_4eb0;
      auVar107 = vbroadcastsd_avx512f(auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_4ea8;
      auVar109 = vbroadcastsd_avx512f(auVar31);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_4ea0;
      auVar110 = vbroadcastsd_avx512f(auVar32);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_4e98;
      auVar111 = vbroadcastsd_avx512f(auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_4e90;
      auVar112 = vbroadcastsd_avx512f(auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_4e88;
      auVar113 = vbroadcastsd_avx512f(auVar35);
      pauVar92 = (undefined1 (*) [64])(local_5000.m_data + 0xb8);
      lVar89 = 0x30;
      do {
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])
                                            ((plain_array<double,_288,_0,_64> *)(pdVar84 + -0xb8))->
                                            array);
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar84 + -0x98));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar84 + -0x78));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar84 + -0x58));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar84 + -0x38));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar84 + -0x18));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-3] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar84 + -0xb0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar84 + -0x90));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar84 + -0x70));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar84 + -0x50));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar84 + -0x30));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar84 + -0x10));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-2] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar84 + -0xa8));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar84 + -0x88));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar84 + -0x68));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar84 + -0x48));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar84 + -0x28));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar84 + -8));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        pauVar92[-1] = auVar114;
        auVar114 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar84 + -0xa0));
        auVar115 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar84 + -0x80));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar84 + -0x60));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar84 + -0x40));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar84 + -0x20));
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        auVar115 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])pdVar84);
        auVar114 = vaddpd_avx512f(auVar114,auVar115);
        *pauVar92 = auVar114;
        pdVar84 = pdVar84 + local_4fe0.m_cols;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + local_5000.m_cols * 8);
        lVar89 = lVar89 + -1;
      } while (lVar89 != 0);
      if (local_4fc0.m_cols != local_5000.m_cols) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                     );
      }
      local_3080 = (undefined1  [8])&local_4fc0;
      TStack_3078.m_matrix = (non_const_type)&local_5000;
      if (((H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != local_4fc0.m_rows) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != local_5000.m_rows)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                      "static void Eigen::internal::Assignment<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                (H,(Matrix<double,__1,__1,_1,__1,__1> *)&local_4fc0,&TStack_3078);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)local_4d80._0_8_) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_0079369d;
      lVar89 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      iVar81 = auVar108._0_4_ + 0x20;
      lVar98 = (long)iVar81 + 0x20;
      iVar86 = auVar108._0_4_ + 0x40;
      lVar87 = (long)iVar86 + 0x20;
      if (lVar89 < lVar93) {
LAB_0079364d:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_00793662;
      }
      auVar112._8_8_ = local_4840._8_8_;
      auVar112._0_8_ = local_4840._0_8_;
      auVar112._16_8_ = local_4840._16_8_;
      auVar112._24_40_ = local_4840._24_40_;
      auVar107 = vmulpd_avx512f(local_4780,local_4780);
      auVar108 = vmulpd_avx512f(local_4480,local_4480);
      auVar107 = vaddpd_avx512f(auVar107,auVar108);
      auVar108 = vmulpd_avx512f(local_4180,local_4180);
      auVar110 = vaddpd_avx512f(auVar107,auVar108);
      auVar107 = vmulpd_avx512f(local_47c0,local_47c0);
      auVar108 = vmulpd_avx512f(local_44c0,local_44c0);
      auVar107 = vaddpd_avx512f(auVar107,auVar108);
      auVar108 = vmulpd_avx512f(local_41c0,local_41c0);
      auVar109 = vaddpd_avx512f(auVar107,auVar108);
      auVar107 = vmulpd_avx512f(local_4800,local_4800);
      auVar108 = vmulpd_avx512f(local_4500,local_4500);
      auVar107 = vaddpd_avx512f(auVar107,auVar108);
      auVar108 = vmulpd_avx512f(local_4200,local_4200);
      auVar108 = vaddpd_avx512f(auVar107,auVar108);
      auVar107 = vmulpd_avx512f(auVar112,auVar112);
      auVar111 = vmulpd_avx512f(local_4540,local_4540);
      auVar107 = vaddpd_avx512f(auVar107,auVar111);
      local_3240 = local_4240;
      auVar111 = vmulpd_avx512f(local_4240,local_4240);
      auVar107 = vaddpd_avx512f(auVar107,auVar111);
      auVar111 = vmulpd_avx512f(local_4740,local_4740);
      local_34c0 = local_4740;
      auVar113 = vmulpd_avx512f(local_4440,local_4440);
      local_3500 = local_4440;
      auVar111 = vaddpd_avx512f(auVar111,auVar113);
      auVar113 = vmulpd_avx512f(local_4140,local_4140);
      local_3540 = local_4140;
      auVar111 = vaddpd_avx512f(auVar111,auVar113);
      auVar113 = vmulpd_avx512f(local_4700,local_4700);
      local_3580 = local_4700;
      auVar114 = vmulpd_avx512f(local_4400,local_4400);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar114 = vmulpd_avx512f(local_4100,local_4100);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      local_3280 = local_46c0;
      auVar114 = vmulpd_avx512f(local_46c0,local_46c0);
      local_32c0 = local_43c0;
      auVar115 = vmulpd_avx512f(local_43c0,local_43c0);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      local_3300 = local_40c0;
      auVar115 = vmulpd_avx512f(local_40c0,local_40c0);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      local_3340 = local_4680;
      auVar115 = vmulpd_avx512f(local_4680,local_4680);
      auVar116 = vmulpd_avx512f(local_4380,local_4380);
      local_3400 = local_4380;
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      local_3380 = local_4080;
      auVar116 = vmulpd_avx512f(local_4080,local_4080);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4640,local_4640);
      auVar117 = vmulpd_avx512f(local_4340,local_4340);
      auVar116 = vaddpd_avx512f(auVar116,auVar117);
      auVar117 = vmulpd_avx512f(local_4040,local_4040);
      auVar116 = vaddpd_avx512f(auVar116,auVar117);
      auVar117 = vmulpd_avx512f(local_4600,local_4600);
      auVar118 = vmulpd_avx512f(local_4300,local_4300);
      auVar117 = vaddpd_avx512f(auVar117,auVar118);
      auVar118 = vmulpd_avx512f(local_4000,local_4000);
      auVar117 = vaddpd_avx512f(auVar117,auVar118);
      auVar118 = vmulpd_avx512f(local_45c0,local_45c0);
      auVar119 = vmulpd_avx512f(local_42c0,local_42c0);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_3fc0,local_3fc0);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_4580,local_4580);
      auVar120 = vmulpd_avx512f(local_4280,local_4280);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_3f80,local_3f80);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      pdVar96 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar120 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar121 = vaddpd_avx512f(auVar107,auVar120);
      auVar107 = *(undefined1 (*) [64])(pdVar96 + local_4e00._0_8_);
      auVar122 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar123 = vmulpd_avx512f(auVar107,auVar122);
      local_4900 = vmulpd_avx512f(auVar123,auVar121);
      auVar111 = vaddpd_avx512f(auVar111,auVar120);
      local_3f40 = vmulpd_avx512f(auVar123,auVar111);
      auVar111 = vaddpd_avx512f(auVar116,auVar120);
      local_48c0 = vmulpd_avx512f(auVar123,auVar111);
      auVar111 = vaddpd_avx512f(auVar120,auVar108);
      auVar108 = *(undefined1 (*) [64])(pdVar96 + local_4e00._0_8_ + 8);
      auVar116 = vmulpd_avx512f(auVar108,auVar122);
      local_4c00 = vmulpd_avx512f(auVar111,auVar116);
      auVar111 = vaddpd_avx512f(auVar120,auVar113);
      local_4e80 = vmulpd_avx512f(auVar116,auVar111);
      auVar111 = vaddpd_avx512f(auVar117,auVar120);
      local_4bc0 = vmulpd_avx512f(auVar116,auVar111);
      auVar111 = vaddpd_avx512f(auVar120,auVar109);
      auVar109 = *(undefined1 (*) [64])(pdVar96 + local_4e00._0_8_ + 0x10);
      auVar113 = vmulpd_avx512f(auVar109,auVar122);
      local_4880 = vmulpd_avx512f(auVar111,auVar113);
      auVar111 = vaddpd_avx512f(auVar120,auVar114);
      local_4d80 = vmulpd_avx512f(auVar113,auVar111);
      auVar111 = vaddpd_avx512f(auVar118,auVar120);
      local_4d00 = vmulpd_avx512f(auVar113,auVar111);
      auVar111 = vaddpd_avx512f(auVar110,auVar120);
      auVar110 = *(undefined1 (*) [64])(pdVar96 + local_4e00._0_8_ + 0x18);
      auVar113 = vmulpd_avx512f(auVar110,auVar122);
      local_4c40 = vmulpd_avx512f(auVar111,auVar113);
      auVar111 = vaddpd_avx512f(auVar120,auVar115);
      local_3f00 = vmulpd_avx512f(auVar113,auVar111);
      auVar111 = vaddpd_avx512f(auVar119,auVar120);
      local_4c80 = vmulpd_avx512f(auVar113,auVar111);
      auVar111 = vmulpd_avx512f(local_4740,local_4640);
      auVar113 = vmulpd_avx512f(local_4440,local_4340);
      auVar111 = vaddpd_avx512f(auVar111,auVar113);
      auVar113 = vmulpd_avx512f(local_4140,local_4040);
      auVar111 = vaddpd_avx512f(auVar111,auVar113);
      auVar113 = vmulpd_avx512f(local_4700,local_4600);
      auVar114 = vmulpd_avx512f(local_4400,local_4300);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar114 = vmulpd_avx512f(local_4100,local_4000);
      local_33c0 = vaddpd_avx512f(auVar113,auVar114);
      auVar113 = vmulpd_avx512f(local_46c0,local_45c0);
      auVar114 = vmulpd_avx512f(local_43c0,local_42c0);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar114 = vmulpd_avx512f(local_40c0,local_3fc0);
      local_3440 = vaddpd_avx512f(auVar113,auVar114);
      auVar113 = vmulpd_avx512f(local_4680,local_4580);
      auVar114 = vmulpd_avx512f(local_4380,local_4280);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar114 = vmulpd_avx512f(local_4080,local_3f80);
      local_3480 = vaddpd_avx512f(auVar113,auVar114);
      auVar113 = vmulpd_avx512f(auVar112,local_4640);
      auVar114 = vmulpd_avx512f(local_4540,local_4340);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar114 = vmulpd_avx512f(local_4240,local_4040);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar114 = vmulpd_avx512f(local_4800,local_4600);
      auVar115 = vmulpd_avx512f(local_4500,local_4300);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4200,local_4000);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_47c0,local_45c0);
      auVar116 = vmulpd_avx512f(local_44c0,local_42c0);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_41c0,local_3fc0);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4780,local_4580);
      auVar117 = vmulpd_avx512f(local_4480,local_4280);
      auVar116 = vaddpd_avx512f(auVar116,auVar117);
      auVar117 = vmulpd_avx512f(local_4180,local_3f80);
      auVar116 = vaddpd_avx512f(auVar116,auVar117);
      auVar112 = vmulpd_avx512f(auVar112,local_4740);
      auVar117 = vmulpd_avx512f(local_4540,local_4440);
      auVar112 = vaddpd_avx512f(auVar112,auVar117);
      auVar117 = vmulpd_avx512f(local_4240,local_4140);
      auVar112 = vaddpd_avx512f(auVar112,auVar117);
      auVar117 = vmulpd_avx512f(local_4800,local_4700);
      auVar118 = vmulpd_avx512f(local_4500,local_4400);
      auVar117 = vaddpd_avx512f(auVar117,auVar118);
      auVar118 = vmulpd_avx512f(local_4200,local_4100);
      auVar117 = vaddpd_avx512f(auVar117,auVar118);
      auVar118 = vmulpd_avx512f(local_47c0,local_46c0);
      auVar119 = vmulpd_avx512f(local_44c0,local_43c0);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_41c0,local_40c0);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_4780,local_4680);
      local_4980 = vmulpd_avx512f(auVar107,auVar111);
      local_4e00 = vmulpd_avx512f(auVar108,local_33c0);
      local_4940 = vmulpd_avx512f(auVar109,local_3440);
      local_4a00 = vmulpd_avx512f(auVar110,local_3480);
      local_4b80 = vmulpd_avx512f(auVar107,auVar113);
      local_4a80 = vmulpd_avx512f(auVar108,auVar114);
      local_4a40 = vmulpd_avx512f(auVar109,auVar115);
      local_4b40 = vmulpd_avx512f(auVar110,auVar116);
      auVar111 = vmulpd_avx512f(local_4480,local_4380);
      auVar111 = vaddpd_avx512f(auVar119,auVar111);
      auVar113 = vmulpd_avx512f(local_4180,local_4080);
      auVar111 = vaddpd_avx512f(auVar111,auVar113);
      local_49c0 = vmulpd_avx512f(auVar107,auVar112);
      local_4ac0 = vmulpd_avx512f(auVar108,auVar117);
      local_4dc0 = vmulpd_avx512f(auVar109,auVar118);
      local_4b00 = vmulpd_avx512f(auVar110,auVar111);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_4fa0._0_8_;
      auVar107 = vbroadcastsd_avx512f(auVar36);
      auVar108 = vmulpd_avx512f(local_4900,auVar107);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_4fa0._8_8_;
      auVar109 = vbroadcastsd_avx512f(auVar37);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_4fa0._16_8_;
      auVar110 = vbroadcastsd_avx512f(auVar38);
      auVar111 = vmulpd_avx512f(local_3f40,auVar109);
      auVar108 = vaddpd_avx512f(auVar108,auVar111);
      auVar111 = vmulpd_avx512f(local_48c0,auVar110);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_4fa0._24_8_;
      auVar112 = vbroadcastsd_avx512f(auVar39);
      auVar108 = vaddpd_avx512f(auVar108,auVar111);
      auVar111 = vmulpd_avx512f(local_4980,auVar112);
      auVar108 = vaddpd_avx512f(auVar108,auVar111);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_4fa0._32_8_;
      auVar111 = vbroadcastsd_avx512f(auVar40);
      auVar113 = vmulpd_avx512f(local_4b80,auVar111);
      auVar108 = vaddpd_avx512f(auVar108,auVar113);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_4fa0._40_8_;
      auVar113 = vbroadcastsd_avx512f(auVar41);
      auVar114 = vmulpd_avx512f(local_49c0,auVar113);
      auVar108 = vaddpd_avx512f(auVar108,auVar114);
      auVar114 = vmulpd_avx512f(local_4c00,auVar107);
      auVar115 = vmulpd_avx512f(local_4e80,auVar109);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4bc0,auVar110);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4e00,auVar112);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4a80,auVar111);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4ac0,auVar113);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4880,auVar107);
      auVar116 = vmulpd_avx512f(local_4d80,auVar109);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4d00,auVar110);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4940,auVar112);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4a40,auVar111);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4dc0,auVar113);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar107 = vmulpd_avx512f(local_4c40,auVar107);
      auVar109 = vmulpd_avx512f(local_3f00,auVar109);
      auVar107 = vaddpd_avx512f(auVar107,auVar109);
      auVar109 = vmulpd_avx512f(local_4c80,auVar110);
      auVar107 = vaddpd_avx512f(auVar107,auVar109);
      auVar109 = vmulpd_avx512f(local_4a00,auVar112);
      auVar107 = vaddpd_avx512f(auVar107,auVar109);
      auVar109 = vmulpd_avx512f(local_4b40,auVar111);
      auVar107 = vaddpd_avx512f(auVar107,auVar109);
      auVar109 = vmulpd_avx512f(local_4b00,auVar113);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_4fa0._48_8_;
      auVar110 = vbroadcastsd_avx512f(auVar42);
      auVar107 = vaddpd_avx512f(auVar107,auVar109);
      auVar109 = vmulpd_avx512f(local_4900,auVar110);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_4fa0._56_8_;
      auVar111 = vbroadcastsd_avx512f(auVar43);
      auVar112 = vmulpd_avx512f(local_3f40,auVar111);
      auVar109 = vaddpd_avx512f(auVar109,auVar112);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_4fa0._64_8_;
      auVar112 = vbroadcastsd_avx512f(auVar44);
      auVar113 = vmulpd_avx512f(local_48c0,auVar112);
      auVar109 = vaddpd_avx512f(auVar109,auVar113);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_4fa0._72_8_;
      auVar113 = vbroadcastsd_avx512f(auVar45);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_4fa0._80_8_;
      auVar116 = vbroadcastsd_avx512f(auVar46);
      auVar117 = vmulpd_avx512f(local_4980,auVar113);
      auVar109 = vaddpd_avx512f(auVar109,auVar117);
      auVar117 = vmulpd_avx512f(local_4b80,auVar116);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_4fa0._88_8_;
      auVar118 = vbroadcastsd_avx512f(auVar47);
      auVar109 = vaddpd_avx512f(auVar109,auVar117);
      auVar117 = vmulpd_avx512f(local_49c0,auVar118);
      auVar109 = vaddpd_avx512f(auVar109,auVar117);
      auVar117 = vmulpd_avx512f(local_4c00,auVar110);
      auVar119 = vmulpd_avx512f(local_4e80,auVar111);
      auVar117 = vaddpd_avx512f(auVar117,auVar119);
      auVar119 = vmulpd_avx512f(local_4bc0,auVar112);
      auVar117 = vaddpd_avx512f(auVar117,auVar119);
      auVar119 = vmulpd_avx512f(local_4e00,auVar113);
      auVar117 = vaddpd_avx512f(auVar117,auVar119);
      auVar119 = vmulpd_avx512f(local_4a80,auVar116);
      auVar117 = vaddpd_avx512f(auVar117,auVar119);
      auVar119 = vmulpd_avx512f(local_4ac0,auVar118);
      auVar117 = vaddpd_avx512f(auVar117,auVar119);
      auVar119 = vmulpd_avx512f(local_4880,auVar110);
      auVar120 = vmulpd_avx512f(local_4d80,auVar111);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_4d00,auVar112);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_4940,auVar113);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_4a40,auVar116);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_4dc0,auVar118);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar110 = vmulpd_avx512f(local_4c40,auVar110);
      auVar111 = vmulpd_avx512f(local_3f00,auVar111);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_4c80,auVar112);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_4a00,auVar113);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_4b40,auVar116);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_4b00,auVar118);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_4f40;
      auVar111 = vbroadcastsd_avx512f(auVar48);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_4f38;
      auVar112 = vbroadcastsd_avx512f(auVar49);
      auVar113 = vmulpd_avx512f(local_4900,auVar111);
      auVar116 = vmulpd_avx512f(local_3f40,auVar112);
      auVar113 = vaddpd_avx512f(auVar113,auVar116);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_4f30;
      auVar116 = vbroadcastsd_avx512f(auVar50);
      auVar118 = vmulpd_avx512f(auVar116,local_48c0);
      auVar113 = vaddpd_avx512f(auVar113,auVar118);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_4f28;
      auVar118 = vbroadcastsd_avx512f(auVar51);
      auVar120 = vmulpd_avx512f(auVar118,local_4980);
      auVar113 = vaddpd_avx512f(auVar113,auVar120);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_4f20;
      auVar120 = vbroadcastsd_avx512f(auVar52);
      auVar121 = vmulpd_avx512f(auVar120,local_4b80);
      auVar113 = vaddpd_avx512f(auVar113,auVar121);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_4f18;
      auVar121 = vbroadcastsd_avx512f(auVar53);
      auVar122 = vmulpd_avx512f(auVar121,local_49c0);
      auVar113 = vaddpd_avx512f(auVar113,auVar122);
      auVar122 = vmulpd_avx512f(auVar111,local_4c00);
      auVar123 = vmulpd_avx512f(auVar112,local_4e80);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(local_4bc0,auVar116);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(local_4e00,auVar118);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(local_4a80,auVar120);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(local_4ac0,auVar121);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(auVar111,local_4880);
      auVar124 = vmulpd_avx512f(local_4d80,auVar112);
      auVar123 = vaddpd_avx512f(auVar123,auVar124);
      auVar124 = vmulpd_avx512f(local_4d00,auVar116);
      auVar123 = vaddpd_avx512f(auVar123,auVar124);
      auVar124 = vmulpd_avx512f(local_4940,auVar118);
      auVar123 = vaddpd_avx512f(auVar123,auVar124);
      auVar124 = vmulpd_avx512f(local_4a40,auVar120);
      auVar123 = vaddpd_avx512f(auVar123,auVar124);
      auVar124 = vmulpd_avx512f(local_4dc0,auVar121);
      auVar123 = vaddpd_avx512f(auVar123,auVar124);
      auVar111 = vmulpd_avx512f(local_4c40,auVar111);
      auVar112 = vmulpd_avx512f(local_3f00,auVar112);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_4c80,auVar116);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_4a00,auVar118);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_4b40,auVar120);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_4b00,auVar121);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_4f10;
      auVar112 = vbroadcastsd_avx512f(auVar54);
      auVar116 = vmulpd_avx512f(local_4900,auVar112);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_4f08;
      auVar118 = vbroadcastsd_avx512f(auVar55);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_4f00;
      auVar120 = vbroadcastsd_avx512f(auVar56);
      auVar121 = vmulpd_avx512f(local_3f40,auVar118);
      auVar116 = vaddpd_avx512f(auVar116,auVar121);
      auVar121 = vmulpd_avx512f(local_48c0,auVar120);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_4ef8;
      auVar124 = vbroadcastsd_avx512f(auVar57);
      auVar116 = vaddpd_avx512f(auVar116,auVar121);
      auVar121 = vmulpd_avx512f(local_4980,auVar124);
      auVar116 = vaddpd_avx512f(auVar116,auVar121);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_4ef0;
      auVar121 = vbroadcastsd_avx512f(auVar58);
      auVar125 = vmulpd_avx512f(local_4b80,auVar121);
      auVar116 = vaddpd_avx512f(auVar116,auVar125);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_4ee8;
      auVar125 = vbroadcastsd_avx512f(auVar59);
      auVar126 = vmulpd_avx512f(local_49c0,auVar125);
      auVar116 = vaddpd_avx512f(auVar116,auVar126);
      auVar126 = vmulpd_avx512f(auVar112,local_4c00);
      auVar127 = vmulpd_avx512f(auVar118,local_4e80);
      auVar126 = vaddpd_avx512f(auVar126,auVar127);
      auVar127 = vmulpd_avx512f(auVar120,local_4bc0);
      auVar126 = vaddpd_avx512f(auVar126,auVar127);
      auVar127 = vmulpd_avx512f(auVar124,local_4e00);
      auVar126 = vaddpd_avx512f(auVar126,auVar127);
      auVar127 = vmulpd_avx512f(auVar121,local_4a80);
      auVar126 = vaddpd_avx512f(auVar126,auVar127);
      auVar127 = vmulpd_avx512f(auVar125,local_4ac0);
      auVar126 = vaddpd_avx512f(auVar126,auVar127);
      auVar127 = vmulpd_avx512f(local_4880,auVar112);
      auVar128 = vmulpd_avx512f(auVar118,local_4d80);
      auVar127 = vaddpd_avx512f(auVar127,auVar128);
      auVar128 = vmulpd_avx512f(auVar120,local_4d00);
      auVar127 = vaddpd_avx512f(auVar127,auVar128);
      auVar128 = vmulpd_avx512f(auVar124,local_4940);
      auVar127 = vaddpd_avx512f(auVar127,auVar128);
      auVar128 = vmulpd_avx512f(auVar121,local_4a40);
      auVar127 = vaddpd_avx512f(auVar127,auVar128);
      auVar128 = vmulpd_avx512f(auVar125,local_4dc0);
      auVar127 = vaddpd_avx512f(auVar127,auVar128);
      auVar112 = vmulpd_avx512f(local_4c40,auVar112);
      auVar118 = vmulpd_avx512f(local_3f00,auVar118);
      auVar112 = vaddpd_avx512f(auVar112,auVar118);
      auVar118 = vmulpd_avx512f(local_4c80,auVar120);
      auVar112 = vaddpd_avx512f(auVar112,auVar118);
      auVar118 = vmulpd_avx512f(local_4a00,auVar124);
      auVar112 = vaddpd_avx512f(auVar112,auVar118);
      auVar118 = vmulpd_avx512f(local_4b40,auVar121);
      auVar112 = vaddpd_avx512f(auVar112,auVar118);
      auVar118 = vmulpd_avx512f(auVar125,local_4b00);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_4ee0;
      auVar120 = vbroadcastsd_avx512f(auVar60);
      auVar112 = vaddpd_avx512f(auVar112,auVar118);
      auVar118 = vmulpd_avx512f(auVar120,local_4900);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_4ed8;
      auVar121 = vbroadcastsd_avx512f(auVar61);
      auVar124 = vmulpd_avx512f(local_3f40,auVar121);
      auVar118 = vaddpd_avx512f(auVar118,auVar124);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_4ed0;
      auVar124 = vbroadcastsd_avx512f(auVar62);
      auVar125 = vmulpd_avx512f(local_48c0,auVar124);
      auVar118 = vaddpd_avx512f(auVar118,auVar125);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_4ec8;
      auVar125 = vbroadcastsd_avx512f(auVar63);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_4ec0;
      auVar128 = vbroadcastsd_avx512f(auVar64);
      auVar129 = vmulpd_avx512f(local_4980,auVar125);
      auVar118 = vaddpd_avx512f(auVar118,auVar129);
      auVar129 = vmulpd_avx512f(local_4b80,auVar128);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_4eb8;
      auVar130 = vbroadcastsd_avx512f(auVar65);
      auVar118 = vaddpd_avx512f(auVar118,auVar129);
      auVar129 = vmulpd_avx512f(local_49c0,auVar130);
      auVar118 = vaddpd_avx512f(auVar118,auVar129);
      auVar129 = vmulpd_avx512f(local_4c00,auVar120);
      auVar131 = vmulpd_avx512f(auVar121,local_4e80);
      auVar129 = vaddpd_avx512f(auVar129,auVar131);
      auVar131 = vmulpd_avx512f(auVar124,local_4bc0);
      auVar129 = vaddpd_avx512f(auVar129,auVar131);
      auVar131 = vmulpd_avx512f(auVar125,local_4e00);
      auVar129 = vaddpd_avx512f(auVar129,auVar131);
      auVar131 = vmulpd_avx512f(auVar128,local_4a80);
      auVar129 = vaddpd_avx512f(auVar129,auVar131);
      auVar131 = vmulpd_avx512f(auVar130,local_4ac0);
      auVar129 = vaddpd_avx512f(auVar129,auVar131);
      auVar131 = vmulpd_avx512f(local_4880,auVar120);
      auVar132 = vmulpd_avx512f(auVar121,local_4d80);
      auVar131 = vaddpd_avx512f(auVar131,auVar132);
      auVar132 = vmulpd_avx512f(auVar124,local_4d00);
      auVar131 = vaddpd_avx512f(auVar131,auVar132);
      auVar132 = vmulpd_avx512f(local_4940,auVar125);
      auVar131 = vaddpd_avx512f(auVar131,auVar132);
      auVar132 = vmulpd_avx512f(auVar128,local_4a40);
      auVar131 = vaddpd_avx512f(auVar131,auVar132);
      auVar132 = vmulpd_avx512f(auVar130,local_4dc0);
      auVar131 = vaddpd_avx512f(auVar131,auVar132);
      auVar120 = vmulpd_avx512f(auVar120,local_4c40);
      auVar121 = vmulpd_avx512f(auVar121,local_3f00);
      auVar120 = vaddpd_avx512f(auVar120,auVar121);
      auVar121 = vmulpd_avx512f(auVar124,local_4c80);
      auVar120 = vaddpd_avx512f(auVar120,auVar121);
      auVar121 = vmulpd_avx512f(local_4a00,auVar125);
      auVar120 = vaddpd_avx512f(auVar120,auVar121);
      auVar121 = vmulpd_avx512f(auVar128,local_4b40);
      auVar120 = vaddpd_avx512f(auVar120,auVar121);
      auVar121 = vmulpd_avx512f(local_4b00,auVar130);
      auVar120 = vaddpd_avx512f(auVar120,auVar121);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_4eb0;
      auVar121 = vbroadcastsd_avx512f(auVar66);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_4ea8;
      auVar124 = vbroadcastsd_avx512f(auVar67);
      auVar125 = vmulpd_avx512f(auVar121,local_4900);
      auVar128 = vmulpd_avx512f(auVar124,local_3f40);
      auVar125 = vaddpd_avx512f(auVar125,auVar128);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_4ea0;
      auVar128 = vbroadcastsd_avx512f(auVar68);
      auVar130 = vmulpd_avx512f(auVar128,local_48c0);
      auVar125 = vaddpd_avx512f(auVar125,auVar130);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_4e98;
      auVar130 = vbroadcastsd_avx512f(auVar69);
      auVar132 = vmulpd_avx512f(local_4980,auVar130);
      auVar125 = vaddpd_avx512f(auVar125,auVar132);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_4e90;
      auVar132 = vbroadcastsd_avx512f(auVar70);
      auVar133 = vmulpd_avx512f(auVar132,local_4b80);
      auVar125 = vaddpd_avx512f(auVar125,auVar133);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_4e88;
      auVar133 = vbroadcastsd_avx512f(auVar71);
      auVar134 = vmulpd_avx512f(local_49c0,auVar133);
      auVar125 = vaddpd_avx512f(auVar125,auVar134);
      auVar134 = vmulpd_avx512f(local_4c00,auVar121);
      auVar135 = vmulpd_avx512f(auVar124,local_4e80);
      auVar134 = vaddpd_avx512f(auVar134,auVar135);
      auVar135 = vmulpd_avx512f(auVar128,local_4bc0);
      auVar134 = vaddpd_avx512f(auVar134,auVar135);
      auVar135 = vmulpd_avx512f(auVar130,local_4e00);
      auVar134 = vaddpd_avx512f(auVar134,auVar135);
      auVar135 = vmulpd_avx512f(auVar132,local_4a80);
      auVar134 = vaddpd_avx512f(auVar134,auVar135);
      auVar135 = vmulpd_avx512f(auVar133,local_4ac0);
      auVar134 = vaddpd_avx512f(auVar134,auVar135);
      auVar135 = vmulpd_avx512f(auVar121,local_4880);
      auVar136 = vmulpd_avx512f(auVar124,local_4d80);
      auVar135 = vaddpd_avx512f(auVar135,auVar136);
      auVar136 = vmulpd_avx512f(auVar128,local_4d00);
      auVar135 = vaddpd_avx512f(auVar135,auVar136);
      auVar136 = vmulpd_avx512f(local_4940,auVar130);
      auVar135 = vaddpd_avx512f(auVar135,auVar136);
      auVar136 = vmulpd_avx512f(auVar132,local_4a40);
      auVar135 = vaddpd_avx512f(auVar135,auVar136);
      auVar136 = vmulpd_avx512f(auVar133,local_4dc0);
      auVar135 = vaddpd_avx512f(auVar135,auVar136);
      auVar121 = vmulpd_avx512f(auVar121,local_4c40);
      auVar124 = vmulpd_avx512f(auVar124,local_3f00);
      auVar121 = vaddpd_avx512f(auVar121,auVar124);
      auVar124 = vmulpd_avx512f(auVar128,local_4c80);
      auVar121 = vaddpd_avx512f(auVar121,auVar124);
      auVar124 = vmulpd_avx512f(auVar130,local_4a00);
      auVar121 = vaddpd_avx512f(auVar121,auVar124);
      auVar124 = vmulpd_avx512f(auVar132,local_4b40);
      auVar121 = vaddpd_avx512f(auVar121,auVar124);
      auVar124 = vmulpd_avx512f(local_4b00,auVar133);
      auVar121 = vaddpd_avx512f(auVar121,auVar124);
      pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar88 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      uVar85 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      pauVar92 = (undefined1 (*) [64])local_2dc0;
      uVar103 = 0;
      pdVar84 = pdVar96;
      pdVar105 = pdVar96;
      do {
        if ((((~((long)uVar85 >> 0x3f) & uVar85) == uVar103) || (iVar81 < 0 || lVar89 < lVar98)) ||
           (iVar86 < 0 || lVar89 < lVar87)) goto LAB_0079364d;
        auVar124 = vmulpd_avx512f(auVar108,*(undefined1 (*) [64])(pdVar84 + local_5030));
        auVar128 = vmulpd_avx512f(auVar125,*(undefined1 (*) [64])(pdVar84 + lVar83));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar118,*(undefined1 (*) [64])(pdVar84 + lVar82));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-0xb] = auVar124;
        auVar124 = vmulpd_avx512f(auVar114,*(undefined1 (*) [64])(pdVar84 + local_5030 + 8));
        auVar128 = vmulpd_avx512f(auVar134,*(undefined1 (*) [64])(pdVar84 + lVar83 + 8));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar129,*(undefined1 (*) [64])(pdVar84 + lVar82 + 8));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-10] = auVar124;
        auVar124 = vmulpd_avx512f(auVar115,*(undefined1 (*) [64])(pdVar84 + local_5030 + 0x10));
        auVar128 = vmulpd_avx512f(auVar135,*(undefined1 (*) [64])(pdVar84 + lVar83 + 0x10));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar131,*(undefined1 (*) [64])(pdVar84 + lVar82 + 0x10));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-9] = auVar124;
        auVar124 = vmulpd_avx512f(auVar107,*(undefined1 (*) [64])(pdVar84 + local_5030 + 0x18));
        auVar128 = vmulpd_avx512f(auVar121,*(undefined1 (*) [64])(pdVar84 + lVar83 + 0x18));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar120,*(undefined1 (*) [64])(pdVar84 + lVar82 + 0x18));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-8] = auVar124;
        if (((lVar88 <= (long)uVar103) || (lVar89 < lVar93)) ||
           ((lVar89 < lVar98 || (lVar89 < lVar87)))) goto LAB_0079364d;
        auVar124 = vmulpd_avx512f(auVar125,*(undefined1 (*) [64])(pdVar105 + local_5030));
        auVar128 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar105 + lVar83));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar116,*(undefined1 (*) [64])(pdVar105 + lVar82));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-7] = auVar124;
        auVar124 = vmulpd_avx512f(auVar134,*(undefined1 (*) [64])(pdVar105 + local_5030 + 8));
        auVar128 = vmulpd_avx512f(auVar117,*(undefined1 (*) [64])(pdVar105 + lVar83 + 8));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar126,*(undefined1 (*) [64])(pdVar105 + lVar82 + 8));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-6] = auVar124;
        auVar124 = vmulpd_avx512f(auVar135,*(undefined1 (*) [64])(pdVar105 + local_5030 + 0x10));
        auVar128 = vmulpd_avx512f(auVar119,*(undefined1 (*) [64])(pdVar105 + lVar83 + 0x10));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar127,*(undefined1 (*) [64])(pdVar105 + lVar82 + 0x10));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-5] = auVar124;
        auVar124 = vmulpd_avx512f(auVar121,*(undefined1 (*) [64])(pdVar105 + local_5030 + 0x18));
        auVar128 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar105 + lVar83 + 0x18));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar105 + lVar82 + 0x18));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-4] = auVar124;
        if (((lVar88 <= (long)uVar103) || (lVar89 < lVar93)) ||
           ((lVar89 < lVar98 || (lVar89 < lVar87)))) goto LAB_0079364d;
        auVar124 = vmulpd_avx512f(auVar118,*(undefined1 (*) [64])(pdVar96 + local_5030));
        auVar128 = vmulpd_avx512f(auVar116,*(undefined1 (*) [64])(pdVar96 + lVar83));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar96 + lVar82));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-3] = auVar124;
        auVar124 = vmulpd_avx512f(auVar129,*(undefined1 (*) [64])(pdVar96 + local_5030 + 8));
        auVar128 = vmulpd_avx512f(auVar126,*(undefined1 (*) [64])(pdVar96 + lVar83 + 8));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar122,*(undefined1 (*) [64])(pdVar96 + lVar82 + 8));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-2] = auVar124;
        auVar124 = vmulpd_avx512f(auVar131,*(undefined1 (*) [64])(pdVar96 + local_5030 + 0x10));
        auVar128 = vmulpd_avx512f(auVar127,*(undefined1 (*) [64])(pdVar96 + lVar83 + 0x10));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar123,*(undefined1 (*) [64])(pdVar96 + lVar82 + 0x10));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        pauVar92[-1] = auVar124;
        auVar124 = vmulpd_avx512f(auVar120,*(undefined1 (*) [64])(pdVar96 + local_5030 + 0x18));
        auVar128 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar96 + lVar83 + 0x18));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        auVar128 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar96 + lVar82 + 0x18));
        auVar124 = vaddpd_avx512f(auVar124,auVar128);
        *pauVar92 = auVar124;
        uVar103 = uVar103 + 1;
        pdVar84 = pdVar84 + lVar89;
        pauVar92 = pauVar92 + 0xc;
        pdVar105 = pdVar105 + lVar89;
        pdVar96 = pdVar96 + lVar89;
      } while (uVar103 != 0x10);
      lVar93 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_4c00._0_8_ = lVar93;
      if (lVar93 < (long)local_4e08) {
LAB_0079366f:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 96, InnerPanel = false]"
        ;
        goto LAB_00793662;
      }
      pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      uVar85 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      uVar85 = ~((long)uVar85 >> 0x3f) & uVar85;
      local_4bc0._0_8_ = uVar85;
      lVar98 = 0x10;
      lVar89 = 8;
      pauVar92 = (undefined1 (*) [64])local_2dc0;
      lVar83 = 0;
      lVar82 = 0;
      uVar103 = 0;
      do {
        if (uVar103 == uVar85) goto LAB_0079366f;
        lVar100 = lVar93 * uVar103;
        pdVar73 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        lVar91 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar99 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        lVar88 = uVar103 * 3 + 1;
        local_4d00._0_8_ = uVar103;
        lVar90 = uVar103 * 3 + 2;
        lVar87 = lVar99 + 1;
        lVar97 = lVar98 * lVar87;
        pdVar84 = (double *)((long)pdVar73 + lVar97);
        lVar102 = lVar89 * lVar87;
        local_4dc0._0_8_ = lVar102;
        local_4d80._0_8_ = lVar83;
        lVar87 = lVar87 * lVar83;
        local_4e80._0_8_ = lVar87;
        local_4e00._0_8_ = pauVar92;
        lVar95 = 0;
        pauVar94 = pauVar92;
        pdVar104 = pdVar73;
        do {
          local_4c90 = local_4c88;
          if ((lVar91 <= (long)(uVar103 * 3)) ||
             ((H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value <= lVar82 + lVar95)) {
LAB_0079362b:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          auVar107 = vmulpd_avx512f(local_35c0,*(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100));
          auVar107 = vmulpd_avx512f(auVar107,pauVar94[-0xb]);
          auVar108 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 8));
          auVar108 = vmulpd_avx512f(auVar108,pauVar94[-10]);
          auVar109 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x10));
          auVar109 = vmulpd_avx512f(auVar109,pauVar94[-9]);
          auVar108 = vaddpd_avx512f(auVar108,auVar109);
          auVar107 = vaddpd_avx512f(auVar107,auVar108);
          auVar108 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x18));
          auVar108 = vmulpd_avx512f(auVar108,pauVar94[-8]);
          auVar109 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x20));
          auVar109 = vmulpd_avx512f(auVar109,pauVar94[-7]);
          auVar110 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x28));
          auVar110 = vmulpd_avx512f(auVar110,pauVar94[-6]);
          auVar109 = vaddpd_avx512f(auVar109,auVar110);
          auVar108 = vaddpd_avx512f(auVar108,auVar109);
          auVar107 = vaddpd_avx512f(auVar107,auVar108);
          auVar108 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x30));
          auVar108 = vmulpd_avx512f(auVar108,pauVar94[-5]);
          auVar109 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x38));
          auVar109 = vmulpd_avx512f(auVar109,pauVar94[-4]);
          auVar110 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x40));
          auVar110 = vmulpd_avx512f(auVar110,pauVar94[-3]);
          auVar109 = vaddpd_avx512f(auVar109,auVar110);
          auVar108 = vaddpd_avx512f(auVar108,auVar109);
          auVar109 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x48));
          auVar109 = vmulpd_avx512f(auVar109,pauVar94[-2]);
          auVar110 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x50));
          auVar110 = vmulpd_avx512f(auVar110,pauVar94[-1]);
          auVar111 = vmulpd_avx512f(local_35c0,
                                    *(undefined1 (*) [64])(pdVar96 + uVar101 + lVar100 + 0x58));
          auVar111 = vmulpd_avx512f(auVar111,*pauVar94);
          auVar110 = vaddpd_avx512f(auVar110,auVar111);
          auVar109 = vaddpd_avx512f(auVar109,auVar110);
          auVar108 = vaddpd_avx512f(auVar108,auVar109);
          auVar107 = vaddpd_avx512f(auVar107,auVar108);
          auVar106 = vextractf64x4_avx512f(auVar107,1);
          dVar137 = auVar107._0_8_ + auVar106._0_8_ + auVar107._8_8_ + auVar106._8_8_ +
                    auVar107._16_8_ + auVar106._16_8_ + auVar107._24_8_ + auVar106._24_8_;
          *(double *)((long)pdVar73 + lVar95 * 8 + lVar87) =
               dVar137 + *(double *)((long)pdVar73 + lVar95 * 8 + lVar87);
          if ((lVar91 <= lVar88) ||
             (((lVar2 = lVar82 + 1 + lVar95,
               (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar2 ||
               (*(double *)((long)pdVar73 + lVar95 * 8 + lVar102) =
                     dVar137 + *(double *)((long)pdVar73 + lVar95 * 8 + lVar102), lVar91 <= lVar90))
              || (lVar3 = lVar82 + 2 + lVar95,
                 (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value <= lVar3)))) goto LAB_0079362b;
          *(double *)((long)pdVar73 + lVar95 * 8 + lVar97) =
               dVar137 + *(double *)((long)pdVar73 + lVar95 * 8 + lVar97);
          if (lVar95 != 0) {
            if ((((lVar91 <= lVar82 + lVar95) ||
                 ((H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value <= (long)(uVar103 * 3))) ||
                ((*(double *)((long)pdVar104 + lVar87) =
                       dVar137 + *(double *)((long)pdVar104 + lVar87), lVar91 <= lVar2 ||
                 (((H->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar88 ||
                  (*(double *)((long)pdVar104 + lVar102) =
                        dVar137 + *(double *)((long)pdVar104 + lVar102), lVar91 <= lVar3)))))) ||
               ((H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value <= lVar90)) goto LAB_0079362b;
            *pdVar84 = dVar137 + *pdVar84;
          }
          pdVar84 = pdVar84 + lVar99 * 3;
          pdVar104 = pdVar104 + lVar99 * 3;
          pauVar94 = pauVar94 + 0xc;
          lVar2 = lVar82 + 3 + lVar95;
          lVar95 = lVar95 + 3;
        } while (lVar2 != 0x30);
        uVar103 = uVar103 + 1;
        lVar82 = lVar82 + 3;
        lVar98 = lVar98 + 0x18;
        lVar89 = lVar89 + 0x18;
        lVar83 = lVar83 + 0x18;
        pauVar92 = pauVar92 + 0xc;
      } while (uVar103 != 0x10);
      if (local_5000.m_data != (double *)0x0) {
        free((void *)local_5000.m_data[-1]);
      }
      if ((DstXprType *)local_4fe0.m_data != (DstXprType *)0x0) {
        free((void *)(((DstXprType *)((long)local_4fe0.m_data + -0x900))->
                     super_PlainObjectBase<Eigen::Matrix<double,_96,_3,_0,_96,_3>_>).m_storage.
                     m_data.array[0x11f]);
      }
      if (local_4fc0.m_data != (double *)0x0) {
        free((void *)local_4fc0.m_data[-1]);
      }
      lVar93 = local_4fa8 + 1;
      local_5004 = local_5004 + 0x60;
      local_5008 = local_5008 + 0x60;
      local_5030 = (ulong)((int)local_5030 + 0x60);
    } while (lVar93 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianContIntNoDamping(ChMatrixRef& H, double Kfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear material model (no damping).  For this style of method, the Jacobian of the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
        // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
        // will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31 ]
        // FC = [F12  F22  F32 ]
        //      [F13  F23  F33 ]
        // =============================================================================
        ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * e_bar.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================
        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose());
            PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Scale the block deformation gradient matrix by the Kfactor weighting factor for the Jacobian and multiply
        // each Gauss quadrature component by its Gauss quadrature weight times the element Jacobian (kGQ)
        // =============================================================================
        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = Kfactor * FC;

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the scaled partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // and the other parameters to correctly integrate across the volume of the element.  This calculation is
        // performed in blocks across all the Gauss quadrature points at the same time.  This value should be store in
        // row major memory layout to align with the access patterns for calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================
        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
        // corresponding Gauss point (m_kGQ) for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*2*E23 = kGQ*(F12*F13+F22*F23+F32*F33)
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*2*E13 = kGQ*(F11*F13+F21*F23+F31*F33)
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*2*E12 = (F11*F12+F21*F22+F31*F32)
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}